

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-array.h
# Opt level: O0

int read_array(coda_cursor_conflict *cursor,void *dst)

{
  coda_dynamic_type_struct *pcVar1;
  int iVar2;
  size_t __n;
  int local_3c;
  coda_endianness system_endianness;
  int i;
  long record_size;
  coda_type_class type_class;
  coda_cdf_variable *variable;
  void *dst_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  __n = (size_t)(int)(*(int *)((long)&pcVar1[2].definition + 4) * pcVar1[3].backend);
  if (pcVar1[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0xd7,"int read_array(const coda_cursor *, void *)");
  }
  if (*(long *)(pcVar1 + 2) == 0) {
    record_size._4_4_ = pcVar1->definition->type_class;
  }
  else {
    record_size._4_4_ = *(coda_type_class *)(*(long *)(*(long *)(pcVar1 + 2) + 8) + 8);
  }
  local_3c = 0;
  while( true ) {
    if (*(int *)&pcVar1[2].definition <= local_3c) {
      if ((record_size._4_4_ != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
        switch(pcVar1[3].backend) {
        case coda_backend_binary:
          break;
        case 2:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap2((void *)((long)dst + (long)local_3c * 2));
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                        ,0x116,"int read_array(const coda_cursor *, void *)");
        case 4:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap4((void *)((long)dst + (long)local_3c * 4));
          }
          break;
        case 8:
          for (local_3c = 0;
              local_3c < *(int *)&pcVar1[2].definition * *(int *)((long)&pcVar1[2].definition + 4);
              local_3c = local_3c + 1) {
            swap8((void *)((long)dst + (long)local_3c * 8));
          }
        }
      }
      return 0;
    }
    if (*(long *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8) < 0) break;
    if (pcVar1[4].definition == (coda_type *)0x0) {
      iVar2 = read_bytes((coda_product *)cursor->product[1].filename,
                         *(int64_t *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8),__n,
                         (void *)((long)dst + (long)local_3c * __n));
      if (iVar2 != 0) {
        return -1;
      }
    }
    else {
      memcpy((void *)((long)dst + (long)local_3c * __n),
             (void *)((long)&(pcVar1[4].definition)->format +
                     *(long *)(*(long *)(pcVar1 + 4) + (long)local_3c * 8)),__n);
    }
    local_3c = local_3c + 1;
  }
  coda_set_error(-200,"Missing record not supported for CDF variable");
  return -1;
}

Assistant:

static int read_array(const coda_cursor *cursor, read_function read_basic_type_function, uint8_t *dst,
                      int basic_type_size, coda_array_ordering array_ordering)
{
    coda_cursor array_cursor;
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    int i;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    array_cursor = *cursor;
    if (num_dims <= 1 || array_ordering != coda_array_ordering_fortran)
    {
        /* C-style array ordering */

        num_elements = 1;
        for (i = 0; i < num_dims; i++)
        {
            num_elements *= dim[i];
        }

        if (num_elements > 0)
        {
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (i = 0; i < num_elements; i++)
            {
                if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
                {
                    return -1;
                }
                if (i < num_elements - 1)
                {
                    if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                    {
                        return -1;
                    }
                }
            }
        }
    }
    else
    {
        long incr[CODA_MAX_NUM_DIMS + 1];
        long increment;
        long c_index;
        long fortran_index;

        /* Fortran-style array ordering */

        incr[0] = 1;
        for (i = 0; i < num_dims; i++)
        {
            incr[i + 1] = incr[i] * dim[i];
        }

        increment = incr[num_dims - 1];
        num_elements = incr[num_dims];

        if (num_elements > 0)
        {
            c_index = 0;
            fortran_index = 0;
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (;;)
            {
                do
                {
                    if ((*read_basic_type_function)(&array_cursor, &dst[fortran_index * basic_type_size]) != 0)
                    {
                        return -1;
                    }
                    c_index++;
                    if (c_index < num_elements)
                    {
                        if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                        {
                            return -1;
                        }
                    }
                    fortran_index += increment;
                } while (fortran_index < num_elements);

                if (c_index == num_elements)
                {
                    break;
                }

                fortran_index += incr[num_dims - 2] - incr[num_dims];
                i = num_dims - 3;
                while (i >= 0 && fortran_index >= incr[i + 2])
                {
                    fortran_index += incr[i] - incr[i + 2];
                    i--;
                }
            }
        }
    }

    return 0;
}